

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O0

opj_bool pi_next_rpcl(opj_pi_iterator_t *pi)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 *puVar5;
  int *piVar6;
  int *piVar7;
  long lVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  char *in_RDI;
  int prcj;
  int prci;
  int rpy;
  int rpx;
  int try1;
  int trx1;
  int try0;
  int trx0;
  int levelno;
  int dy;
  int dx;
  int resno;
  int compno;
  long index;
  opj_pi_resolution_t *res;
  opj_pi_comp_t *comp;
  int local_64;
  int local_60;
  int local_30;
  int local_2c;
  
  if (*(int *)(in_RDI + 0x30) != 0) {
    in_RDI[0x30] = '\0';
    in_RDI[0x31] = '\0';
    in_RDI[0x32] = '\0';
    in_RDI[0x33] = '\0';
    in_RDI[0xf0] = '\0';
    in_RDI[0xf1] = '\0';
    in_RDI[0xf2] = '\0';
    in_RDI[0xf3] = '\0';
    in_RDI[0xf4] = '\0';
    in_RDI[0xf5] = '\0';
    in_RDI[0xf6] = '\0';
    in_RDI[0xf7] = '\0';
    for (local_2c = 0; local_2c < *(int *)(in_RDI + 200); local_2c = local_2c + 1) {
      piVar6 = (int *)(*(long *)(in_RDI + 0xd0) + (long)local_2c * 0x18);
      for (local_30 = 0; local_30 < piVar6[2]; local_30 = local_30 + 1) {
        puVar5 = (undefined4 *)(*(long *)(piVar6 + 4) + (long)local_30 * 0x10);
        local_60 = *piVar6 * (1 << (((char)*puVar5 + (char)piVar6[2] + -1) - (char)local_30 & 0x1fU)
                             );
        local_64 = piVar6[1] *
                   (1 << (((char)puVar5[1] + (char)piVar6[2] + -1) - (char)local_30 & 0x1fU));
        if (*(int *)(in_RDI + 0xf0) != 0) {
          local_60 = int_min(*(int *)(in_RDI + 0xf0),local_60);
        }
        *(int *)(in_RDI + 0xf0) = local_60;
        if (*(int *)(in_RDI + 0xf4) != 0) {
          local_64 = int_min(*(int *)(in_RDI + 0xf4),local_64);
        }
        *(int *)(in_RDI + 0xf4) = local_64;
      }
    }
    if (*in_RDI == '\0') {
      *(undefined4 *)(in_RDI + 0x70) = *(undefined4 *)(in_RDI + 0xdc);
      *(undefined4 *)(in_RDI + 0x68) = *(undefined4 *)(in_RDI + 0xd8);
      *(undefined4 *)(in_RDI + 0x74) = *(undefined4 *)(in_RDI + 0xe4);
      *(undefined4 *)(in_RDI + 0x6c) = *(undefined4 *)(in_RDI + 0xe0);
    }
    *(undefined4 *)(in_RDI + 0x24) = *(undefined4 *)(in_RDI + 0x34);
    goto LAB_0014c170;
  }
  do {
    *(int *)(in_RDI + 0x2c) = *(int *)(in_RDI + 0x2c) + 1;
    while (*(uint *)(in_RDI + 0x3c) <= *(uint *)(in_RDI + 0x2c)) {
      do {
        do {
          *(int *)(in_RDI + 0x20) = *(int *)(in_RDI + 0x20) + 1;
          while (*(uint *)(in_RDI + 0x44) <= *(uint *)(in_RDI + 0x20)) {
            *(int *)(in_RDI + 0xe8) =
                 (*(int *)(in_RDI + 0xf0) - *(int *)(in_RDI + 0xe8) % *(int *)(in_RDI + 0xf0)) +
                 *(int *)(in_RDI + 0xe8);
            while (*(int *)(in_RDI + 0x6c) <= *(int *)(in_RDI + 0xe8)) {
              *(int *)(in_RDI + 0xec) =
                   (*(int *)(in_RDI + 0xf4) - *(int *)(in_RDI + 0xec) % *(int *)(in_RDI + 0xf4)) +
                   *(int *)(in_RDI + 0xec);
              while (*(int *)(in_RDI + 0x74) <= *(int *)(in_RDI + 0xec)) {
                *(int *)(in_RDI + 0x24) = *(int *)(in_RDI + 0x24) + 1;
LAB_0014c170:
                if (*(uint *)(in_RDI + 0x40) <= *(uint *)(in_RDI + 0x24)) {
                  return 0;
                }
                *(undefined4 *)(in_RDI + 0xec) = *(undefined4 *)(in_RDI + 0x70);
              }
              *(undefined4 *)(in_RDI + 0xe8) = *(undefined4 *)(in_RDI + 0x68);
            }
            *(undefined4 *)(in_RDI + 0x20) = *(undefined4 *)(in_RDI + 0x38);
          }
          piVar6 = (int *)(*(long *)(in_RDI + 0xd0) + (long)*(int *)(in_RDI + 0x20) * 0x18);
        } while (piVar6[2] <= *(int *)(in_RDI + 0x24));
        piVar7 = (int *)(*(long *)(piVar6 + 4) + (long)*(int *)(in_RDI + 0x24) * 0x10);
        bVar9 = ((char)piVar6[2] + -1) - (char)*(undefined4 *)(in_RDI + 0x24);
        iVar1 = int_ceildiv(*(int *)(in_RDI + 0xd8),*piVar6 << (bVar9 & 0x1f));
        iVar2 = int_ceildiv(*(int *)(in_RDI + 0xdc),piVar6[1] << (bVar9 & 0x1f));
        iVar3 = int_ceildiv(*(int *)(in_RDI + 0xe0),*piVar6 << (bVar9 & 0x1f));
        iVar4 = int_ceildiv(*(int *)(in_RDI + 0xe4),piVar6[1] << (bVar9 & 0x1f));
        bVar10 = (char)*piVar7 + bVar9;
        bVar11 = (char)piVar7[1] + bVar9;
      } while ((((*(int *)(in_RDI + 0xec) % (piVar6[1] << (bVar11 & 0x1f)) != 0) &&
                ((*(int *)(in_RDI + 0xec) != *(int *)(in_RDI + 0xdc) ||
                 ((iVar2 << (bVar9 & 0x1f)) % (1 << (bVar11 & 0x1f)) == 0)))) ||
               ((*(int *)(in_RDI + 0xe8) % (*piVar6 << (bVar10 & 0x1f)) != 0 &&
                ((*(int *)(in_RDI + 0xe8) != *(int *)(in_RDI + 0xd8) ||
                 ((iVar1 << (bVar9 & 0x1f)) % (1 << (bVar10 & 0x1f)) == 0)))))) ||
              ((piVar7[2] == 0 || (((piVar7[3] == 0 || (iVar1 == iVar3)) || (iVar2 == iVar4))))));
      iVar3 = int_ceildiv(*(int *)(in_RDI + 0xe8),*piVar6 << (bVar9 & 0x1f));
      iVar3 = int_floordivpow2(iVar3,*piVar7);
      iVar1 = int_floordivpow2(iVar1,*piVar7);
      iVar4 = int_ceildiv(*(int *)(in_RDI + 0xec),piVar6[1] << (bVar9 & 0x1f));
      iVar4 = int_floordivpow2(iVar4,piVar7[1]);
      iVar2 = int_floordivpow2(iVar2,piVar7[1]);
      *(int *)(in_RDI + 0x28) = (iVar3 - iVar1) + (iVar4 - iVar2) * piVar7[2];
      *(undefined4 *)(in_RDI + 0x2c) = *(undefined4 *)(in_RDI + 0x48);
    }
    lVar8 = (long)(*(int *)(in_RDI + 0x2c) * *(int *)(in_RDI + 0x10) +
                   *(int *)(in_RDI + 0x24) * *(int *)(in_RDI + 0x14) +
                   *(int *)(in_RDI + 0x20) * *(int *)(in_RDI + 0x18) +
                  *(int *)(in_RDI + 0x28) * *(int *)(in_RDI + 0x1c));
    if (*(short *)(*(long *)(in_RDI + 8) + lVar8 * 2) == 0) {
      *(undefined2 *)(*(long *)(in_RDI + 8) + lVar8 * 2) = 1;
      return 1;
    }
  } while( true );
}

Assistant:

static opj_bool pi_next_rpcl(opj_pi_iterator_t * pi) {
	opj_pi_comp_t *comp = NULL;
	opj_pi_resolution_t *res = NULL;
	long index = 0;

	if (!pi->first) {
		goto LABEL_SKIP;
	} else {
		int compno, resno;
		pi->first = 0;
		pi->dx = 0;
		pi->dy = 0;
		for (compno = 0; compno < pi->numcomps; compno++) {
			comp = &pi->comps[compno];
			for (resno = 0; resno < comp->numresolutions; resno++) {
				int dx, dy;
				res = &comp->resolutions[resno];
				dx = comp->dx * (1 << (res->pdx + comp->numresolutions - 1 - resno));
				dy = comp->dy * (1 << (res->pdy + comp->numresolutions - 1 - resno));
				pi->dx = !pi->dx ? dx : int_min(pi->dx, dx);
				pi->dy = !pi->dy ? dy : int_min(pi->dy, dy);
			}
		}
	}
if (!pi->tp_on){
			pi->poc.ty0 = pi->ty0;
			pi->poc.tx0 = pi->tx0;
			pi->poc.ty1 = pi->ty1;
			pi->poc.tx1 = pi->tx1;
		}
	for (pi->resno = pi->poc.resno0; pi->resno < pi->poc.resno1; pi->resno++) {
		for (pi->y = pi->poc.ty0; pi->y < pi->poc.ty1; pi->y += pi->dy - (pi->y % pi->dy)) {
			for (pi->x = pi->poc.tx0; pi->x < pi->poc.tx1; pi->x += pi->dx - (pi->x % pi->dx)) {
				for (pi->compno = pi->poc.compno0; pi->compno < pi->poc.compno1; pi->compno++) {
					int levelno;
					int trx0, try0;
					int trx1, try1;
					int rpx, rpy;
					int prci, prcj;
					comp = &pi->comps[pi->compno];
					if (pi->resno >= comp->numresolutions) {
						continue;
					}
					res = &comp->resolutions[pi->resno];
					levelno = comp->numresolutions - 1 - pi->resno;
					trx0 = int_ceildiv(pi->tx0, comp->dx << levelno);
					try0 = int_ceildiv(pi->ty0, comp->dy << levelno);
					trx1 = int_ceildiv(pi->tx1, comp->dx << levelno);
					try1 = int_ceildiv(pi->ty1, comp->dy << levelno);
					rpx = res->pdx + levelno;
					rpy = res->pdy + levelno;
					if (!((pi->y % (comp->dy << rpy) == 0) || ((pi->y == pi->ty0) && ((try0 << levelno) % (1 << rpy))))){
						continue;	
					}
					if (!((pi->x % (comp->dx << rpx) == 0) || ((pi->x == pi->tx0) && ((trx0 << levelno) % (1 << rpx))))){
						continue; 
					}
					
					if ((res->pw==0)||(res->ph==0)) continue;
					
					if ((trx0==trx1)||(try0==try1)) continue;
					
					prci = int_floordivpow2(int_ceildiv(pi->x, comp->dx << levelno), res->pdx) 
						 - int_floordivpow2(trx0, res->pdx);
					prcj = int_floordivpow2(int_ceildiv(pi->y, comp->dy << levelno), res->pdy) 
						 - int_floordivpow2(try0, res->pdy);
					pi->precno = prci + prcj * res->pw;
					for (pi->layno = pi->poc.layno0; pi->layno < pi->poc.layno1; pi->layno++) {
						index = pi->layno * pi->step_l + pi->resno * pi->step_r + pi->compno * pi->step_c + pi->precno * pi->step_p;
						if (!pi->include[index]) {
							pi->include[index] = 1;
							return OPJ_TRUE;
						}
LABEL_SKIP:;
					}
				}
			}
		}
	}
	
	return OPJ_FALSE;
}